

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msocket.c
# Opt level: O3

void msocket_destroy(msocket_t *self)

{
  if (self != (msocket_t *)0x0) {
    msocket_close(self);
    msocket_bytearray_destroy(&self->tcpRxBuf);
    pthread_mutex_destroy((pthread_mutex_t *)&self->mutex);
    if (self->handlerTable != (msocket_handler_t *)0x0) {
      free(self->handlerTable);
      return;
    }
  }
  return;
}

Assistant:

void msocket_destroy(msocket_t *self){
	if( self != 0 ){
      msocket_close(self);
      msocket_bytearray_destroy(&self->tcpRxBuf);
      MUTEX_DESTROY(self->mutex);
      if(self->handlerTable != 0){
         free(self->handlerTable);
      }
   }
}